

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp3::sPolynomial11
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[0xdc];
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0xcd];
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar3 = vxorpd_avx512vl(auVar4,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xb0] = auVar3._0_8_ / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0x71];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xbf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xbc] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xeb] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xce] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xcb] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xfa] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xdd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xda] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xec] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xe9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xfb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xf8] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x109] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x10a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x107] / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::sPolynomial11( Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  groebnerMatrix(11,11) = -groebnerMatrix(10,14)/(groebnerMatrix(10,13));
  groebnerMatrix(11,12) = (groebnerMatrix(8,12)/(groebnerMatrix(8,7))-groebnerMatrix(10,15)/(groebnerMatrix(10,13)));
  groebnerMatrix(11,13) = (groebnerMatrix(8,13)/(groebnerMatrix(8,7))-groebnerMatrix(10,16)/(groebnerMatrix(10,13)));
  groebnerMatrix(11,14) = groebnerMatrix(8,14)/(groebnerMatrix(8,7));
  groebnerMatrix(11,15) = groebnerMatrix(8,15)/(groebnerMatrix(8,7));
  groebnerMatrix(11,16) = (groebnerMatrix(8,16)/(groebnerMatrix(8,7))-groebnerMatrix(10,17)/(groebnerMatrix(10,13)));
  groebnerMatrix(11,17) = groebnerMatrix(8,17)/(groebnerMatrix(8,7));
}